

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall
tinygltf::TinyGLTF::LoadBinaryFromFile
          (TinyGLTF *this,Model *model,string *err,string *warn,string *filename,uint check_sections
          )

{
  bool bVar1;
  reference bytes;
  ostream *poVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string fileerr;
  string basedir;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if ((this->fs).ReadWholeFile.super__Function_base._M_manager == (_Manager_type)0x0) {
    poVar2 = std::operator<<(local_1a8,"Failed to read file: ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    poVar2 = std::operator<<(poVar2,": one or more FS callback not set");
    std::endl<char,std::char_traits<char>>(poVar2);
    if (err != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)err,(string *)&fileerr);
      std::__cxx11::string::~string((string *)&fileerr);
    }
    bVar1 = false;
  }
  else {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fileerr._M_dataplus._M_p = (pointer)&fileerr.field_2;
    fileerr._M_string_length = 0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    fileerr.field_2._M_local_buf[0] = '\0';
    bVar1 = std::
            function<bool_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void_*)>
            ::operator()(&(this->fs).ReadWholeFile,&data,&fileerr,filename,(this->fs).user_data);
    if (bVar1) {
      GetBaseDir(&basedir,filename);
      bytes = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,0);
      bVar1 = LoadBinaryFromMemory
                        (this,model,err,warn,bytes,
                         (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                         (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start,&basedir,check_sections);
      std::__cxx11::string::~string((string *)&basedir);
    }
    else {
      poVar2 = std::operator<<(local_1a8,"Failed to read file: ");
      poVar2 = std::operator<<(poVar2,(string *)filename);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,(string *)&fileerr);
      std::endl<char,std::char_traits<char>>(poVar2);
      if (err != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)err,(string *)&basedir);
        std::__cxx11::string::~string((string *)&basedir);
      }
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&fileerr);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return bVar1;
}

Assistant:

bool TinyGLTF::LoadBinaryFromFile(Model *model, std::string *err,
                                  std::string *warn,
                                  const std::string &filename,
                                  unsigned int check_sections) {
  std::stringstream ss;

  if (fs.ReadWholeFile == nullptr) {
    // Programmer error, assert() ?
    ss << "Failed to read file: " << filename
       << ": one or more FS callback not set" << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  std::vector<unsigned char> data;
  std::string fileerr;
  bool fileread = fs.ReadWholeFile(&data, &fileerr, filename, fs.user_data);
  if (!fileread) {
    ss << "Failed to read file: " << filename << ": " << fileerr << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  std::string basedir = GetBaseDir(filename);

  bool ret = LoadBinaryFromMemory(model, err, warn, &data.at(0),
                                  static_cast<unsigned int>(data.size()),
                                  basedir, check_sections);

  return ret;
}